

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_path_and_type.cpp
# Opt level: O3

void duckdb::DBPathAndType::CheckMagicBytes(FileSystem *fs,string *path,string *db_type)

{
  DataFileType DVar1;
  
  DVar1 = MagicBytes::CheckMagicBytes(fs,path);
  if (DVar1 == SQLITE_FILE) {
    ::std::__cxx11::string::_M_replace((ulong)db_type,0,(char *)db_type->_M_string_length,0x1dc2f05)
    ;
    return;
  }
  ::std::__cxx11::string::_M_replace((ulong)db_type,0,(char *)db_type->_M_string_length,0x1f53803);
  return;
}

Assistant:

void DBPathAndType::CheckMagicBytes(FileSystem &fs, string &path, string &db_type) {
	// if there isn't - check the magic bytes of the file (if any)
	auto file_type = MagicBytes::CheckMagicBytes(fs, path);
	if (file_type == DataFileType::SQLITE_FILE) {
		db_type = "sqlite";
	} else {
		db_type = "";
	}
}